

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

SoundFont * __thiscall sf2cute::SoundFont::operator=(SoundFont *this,SoundFont *origin)

{
  bool bVar1;
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
  *pvVar2;
  size_type sVar3;
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  *pvVar4;
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  *pvVar5;
  undefined1 local_b8 [24];
  shared_ptr<sf2cute::SFSample> *sample;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  *__range1_2;
  undefined1 local_78 [8];
  shared_ptr<sf2cute::SFInstrument> *instrument;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  *__range1_1;
  undefined1 local_48 [24];
  shared_ptr<sf2cute::SFPreset> *preset;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
  *__range1;
  SoundFont *origin_local;
  SoundFont *this_local;
  
  std::
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>::
  clear(&this->presets_);
  pvVar2 = presets(origin);
  sVar3 = std::
          vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
          ::size(pvVar2);
  std::
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>::
  reserve(&this->presets_,sVar3);
  pvVar2 = presets(origin);
  __end1 = std::
           vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
           ::begin(pvVar2);
  preset = (shared_ptr<sf2cute::SFPreset> *)
           std::
           vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
           ::end(pvVar2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<sf2cute::SFPreset>_*,_std::vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>_>
                                *)&preset);
    if (!bVar1) break;
    local_48._16_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<sf2cute::SFPreset>_*,_std::vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>_>
         ::operator*(&__end1);
    std::__shared_ptr_access<sf2cute::SFPreset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<sf2cute::SFPreset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_48._16_8_);
    std::make_shared<sf2cute::SFPreset,sf2cute::SFPreset&>((SFPreset *)local_48);
    std::
    vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
    ::push_back(&this->presets_,(value_type *)local_48);
    std::shared_ptr<sf2cute::SFPreset>::~shared_ptr((shared_ptr<sf2cute::SFPreset> *)local_48);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<sf2cute::SFPreset>_*,_std::vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::clear(&this->instruments_);
  pvVar4 = instruments(origin);
  sVar3 = std::
          vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
          ::size(pvVar4);
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::reserve(&this->instruments_,sVar3);
  pvVar4 = instruments(origin);
  __end1_1 = std::
             vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
             ::begin(pvVar4);
  instrument = (shared_ptr<sf2cute::SFInstrument> *)
               std::
               vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
               ::end(pvVar4);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                        *)&instrument);
    if (!bVar1) break;
    local_78 = (undefined1  [8])
               __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
               ::operator*(&__end1_1);
    std::__shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*((__shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_78);
    std::make_shared<sf2cute::SFInstrument,sf2cute::SFInstrument&>((SFInstrument *)&__range1_2);
    std::
    vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
    ::push_back(&this->instruments_,(value_type *)&__range1_2);
    std::shared_ptr<sf2cute::SFInstrument>::~shared_ptr
              ((shared_ptr<sf2cute::SFInstrument> *)&__range1_2);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
    ::operator++(&__end1_1);
  }
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  clear(&this->samples_);
  pvVar5 = samples(origin);
  sVar3 = std::
          vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
          ::size(pvVar5);
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  reserve(&this->samples_,sVar3);
  pvVar5 = samples(origin);
  __end1_2 = std::
             vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
             ::begin(pvVar5);
  sample = (shared_ptr<sf2cute::SFSample> *)
           std::
           vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ::end(pvVar5);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_2,
                       (__normal_iterator<const_std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
                        *)&sample);
    if (!bVar1) break;
    local_b8._16_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
         ::operator*(&__end1_2);
    std::__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_b8._16_8_);
    std::make_shared<sf2cute::SFSample,sf2cute::SFSample&>((SFSample *)local_b8);
    std::
    vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
    ::push_back(&this->samples_,(value_type *)local_b8);
    std::shared_ptr<sf2cute::SFSample>::~shared_ptr((shared_ptr<sf2cute::SFSample> *)local_b8);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
    ::operator++(&__end1_2);
  }
  std::__cxx11::string::operator=((string *)&this->sound_engine_,(string *)&origin->sound_engine_);
  std::__cxx11::string::operator=((string *)&this->bank_name_,(string *)&origin->bank_name_);
  std::__cxx11::string::operator=((string *)&this->rom_name_,(string *)&origin->rom_name_);
  this->rom_version_ = origin->rom_version_;
  this->has_rom_version_ = (bool)(origin->has_rom_version_ & 1);
  std::__cxx11::string::operator=((string *)&this->creation_date_,(string *)&origin->creation_date_)
  ;
  std::__cxx11::string::operator=((string *)&this->engineers_,(string *)&origin->engineers_);
  std::__cxx11::string::operator=((string *)&this->product_,(string *)&origin->product_);
  std::__cxx11::string::operator=((string *)&this->copyright_,(string *)&origin->copyright_);
  std::__cxx11::string::operator=((string *)&this->comment_,(string *)&origin->comment_);
  std::__cxx11::string::operator=((string *)&this->software_,(string *)&origin->software_);
  SetBackwardReferences(this);
  RepairReferences(this,origin);
  return this;
}

Assistant:

SoundFont & SoundFont::operator=(const SoundFont & origin) {
  // Copy presets.
  presets_.clear();
  presets_.reserve(origin.presets().size());
  for (const auto & preset : origin.presets()) {
    presets_.push_back(std::make_shared<SFPreset>(*preset));
  }

  // Copy instruments.
  instruments_.clear();
  instruments_.reserve(origin.instruments().size());
  for (const auto & instrument : origin.instruments()) {
    instruments_.push_back(std::make_shared<SFInstrument>(*instrument));
  }

  // Copy samples.
  samples_.clear();
  samples_.reserve(origin.samples().size());
  for (const auto & sample : origin.samples()) {
    samples_.push_back(std::make_shared<SFSample>(*sample));
  }

  // Copy other fields.
  sound_engine_ = origin.sound_engine_;
  bank_name_ = origin.bank_name_;
  rom_name_ = origin.rom_name_;
  rom_version_ = origin.rom_version_;
  has_rom_version_ = origin.has_rom_version_;
  creation_date_ = origin.creation_date_;
  engineers_ = origin.engineers_;
  product_ = origin.product_;
  copyright_ = origin.copyright_;
  comment_ = origin.comment_;
  software_ = origin.software_;

  // Repair references.
  SetBackwardReferences();
  RepairReferences(origin);

  return *this;
}